

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

DWORD __thiscall TSparseArray::GetItemValueAt(TSparseArray *this,size_t index)

{
  DWORD DVar1;
  _BASEVALS *p_Var2;
  uint *puVar3;
  DWORD local_24;
  DWORD BitMask;
  DWORD IntValue;
  BASEVALS *SetBitsCount;
  size_t index_local;
  TSparseArray *this_local;
  
  p_Var2 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,index >> 9);
  local_24 = p_Var2->BaseValue200;
  SetBitsCount._0_4_ = (uint)index;
  switch((uint)SetBitsCount >> 6 & 7) {
  case 1:
    local_24 = ((uint)*(undefined8 *)&p_Var2->field_0x4 & 0x7f) + local_24;
    break;
  case 2:
    local_24 = ((uint)(*(ulong *)&p_Var2->field_0x4 >> 7) & 0xff) + local_24;
    break;
  case 3:
    local_24 = ((uint)(*(ulong *)&p_Var2->field_0x4 >> 0xf) & 0xff) + local_24;
    break;
  case 4:
    local_24 = ((uint)(*(ulong *)&p_Var2->field_0x4 >> 0x17) & 0x1ff) + local_24;
    break;
  case 5:
    local_24 = ((uint)((ulong)*(undefined8 *)&p_Var2->field_0x4 >> 0x20) & 0x1ff) + local_24;
    break;
  case 6:
    local_24 = ((uint)((ulong)*(undefined8 *)&p_Var2->field_0x4 >> 0x29) & 0x1ff) + local_24;
    break;
  case 7:
    local_24 = ((uint)((ulong)*(undefined8 *)&p_Var2->field_0x4 >> 0x32) & 0x1ff) + local_24;
  }
  if ((index & 0x20) != 0) {
    puVar3 = TGenericArray<unsigned_int>::operator[](&this->ItemBits,(index >> 5) - 1);
    DVar1 = GetNumberOfSetBits32(*puVar3);
    local_24 = DVar1 + local_24;
  }
  puVar3 = TGenericArray<unsigned_int>::operator[](&this->ItemBits,index >> 5);
  DVar1 = GetNumberOfSetBits32(*puVar3 & (1 << ((byte)index & 0x1f)) - 1U);
  return local_24 + DVar1;
}

Assistant:

DWORD GetItemValueAt(size_t index)
    {
        BASEVALS & SetBitsCount = BaseVals[index >> 0x09];
        DWORD IntValue;
        DWORD BitMask;

        //
        // Since we don't want to count bits for the entire array,
        // there are item value shortcuts every 0x200 items,
        // and then every 0x40 items above the 0x200 base
        //

        // 1) We have base value for every 0x200-th item
        IntValue = SetBitsCount.BaseValue200;

        // 2) Add the base value for each 0x40-th item above the 0x200 base
        switch(((index >> 0x06) & 0x07) - 1)
        {
            case 0:     // Add the 1st value (7 bits)
                IntValue += SetBitsCount.AddValue40;
                break;

            case 1:     // Add the 2nd value (8 bits)
                IntValue += SetBitsCount.AddValue80;
                break;

            case 2:     // Add the 3rd value (8 bits)
                IntValue += SetBitsCount.AddValueC0;
                break;

            case 3:     // Add the 4th value (9 bits)
                IntValue += SetBitsCount.AddValue100;
                break;

            case 4:     // Add the 5th value (9 bits)
                IntValue += SetBitsCount.AddValue140;
                break;

            case 5:     // Add the 6th value (9 bits)
                IntValue += SetBitsCount.AddValue180;
                break;

            case 6:     // Add the 7th value (9 bits)
                IntValue += SetBitsCount.AddValue1C0;
                break;
        }

        // 3) Count the bits of the higher DWORD, if the index 0x20 - 0x30 above the 0x200 base
        if(index & 0x20)
            IntValue += GetNumberOfSetBits32(ItemBits[(index >> 0x05) - 1]);

        // 4) Count the bits in the current DWORD (masked by bit index mask) 
        BitMask = (1 << (index & 0x1F)) - 1;
        return IntValue + GetNumberOfSetBits32(ItemBits[index >> 0x05] & BitMask);
    }